

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O2

LogStreamParam * __thiscall
cppnet::BaseLogger::GetStreamParam
          (LogStreamParam *__return_storage_ptr__,BaseLogger *this,LogLevel level,char *file,
          uint32_t line)

{
  uint32_t uVar1;
  char *level_00;
  shared_ptr<cppnet::Log> log;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  undefined1 local_58 [48];
  
  if ((int)(uint)this->_level < (int)level) {
    (__return_storage_ptr__->second).super__Function_base._M_manager = (_Manager_type)0x0;
    (__return_storage_ptr__->second)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->second).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).super__Function_base._M_functor + 8) = 0
    ;
    (__return_storage_ptr__->first).super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->first).super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    return __return_storage_ptr__;
  }
  GetLog((BaseLogger *)local_58);
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (BaseLogger *)0x0;
  local_78._8_8_ = 0;
  switch(level) {
  case LL_NULL:
    goto switchD_00117a66_caseD_0;
  case LL_FATAL:
    local_58._32_8_ = 0;
    local_78._8_8_ = 0;
    local_58._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58._24_8_ = 0;
    local_58._40_8_ = 0;
    local_68 = std::
               _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:157:14)>
               ::_M_manager;
    pcStack_60 = std::
                 _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:157:14)>
                 ::_M_invoke;
    local_78._M_unused._M_object = this;
    std::_Function_base::~_Function_base((_Function_base *)(local_58 + 0x10));
    level_00 = "FAT";
    break;
  case 2:
  case 4:
  case 5:
  case 6:
switchD_00117a66_caseD_2:
    (__return_storage_ptr__->second).super__Function_base._M_manager = (_Manager_type)0x0;
    (__return_storage_ptr__->second)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->second).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).super__Function_base._M_functor + 8) = 0
    ;
    (__return_storage_ptr__->first).super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->first).super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_00117c2f;
  case LL_ERROR:
    local_58._32_8_ = 0;
    local_78._8_8_ = 0;
    local_58._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58._24_8_ = 0;
    local_58._40_8_ = 0;
    local_68 = std::
               _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:161:14)>
               ::_M_manager;
    pcStack_60 = std::
                 _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:161:14)>
                 ::_M_invoke;
    local_78._M_unused._M_object = this;
    std::_Function_base::~_Function_base((_Function_base *)(local_58 + 0x10));
    level_00 = "ERR";
    break;
  case LL_WARN:
    local_58._32_8_ = 0;
    local_78._8_8_ = 0;
    local_58._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58._24_8_ = 0;
    local_58._40_8_ = 0;
    local_68 = std::
               _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:165:14)>
               ::_M_manager;
    pcStack_60 = std::
                 _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:165:14)>
                 ::_M_invoke;
    local_78._M_unused._M_object = this;
    std::_Function_base::~_Function_base((_Function_base *)(local_58 + 0x10));
    level_00 = "WAR";
    break;
  default:
    if (level == LL_INFO) {
      local_58._32_8_ = 0;
      local_78._8_8_ = 0;
      local_58._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58._24_8_ = 0;
      local_58._40_8_ = 0;
      local_68 = std::
                 _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:169:14)>
                 ::_M_manager;
      pcStack_60 = std::
                   _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:169:14)>
                   ::_M_invoke;
      local_78._M_unused._M_object = this;
      std::_Function_base::~_Function_base((_Function_base *)(local_58 + 0x10));
      level_00 = "INF";
    }
    else {
      if (level != LL_DEBUG) goto switchD_00117a66_caseD_2;
      local_58._32_8_ = 0;
      local_78._8_8_ = 0;
      local_58._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58._24_8_ = 0;
      local_58._40_8_ = 0;
      local_68 = std::
                 _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:173:14)>
                 ::_M_manager;
      pcStack_60 = std::
                   _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:173:14)>
                   ::_M_invoke;
      local_78._M_unused._M_object = this;
      std::_Function_base::~_Function_base((_Function_base *)(local_58 + 0x10));
      level_00 = "DEB";
    }
  }
  uVar1 = FormatLog(file,line,level_00,*(char **)local_58._0_8_,*(uint32_t *)(local_58._0_8_ + 8));
  *(uint32_t *)(local_58._0_8_ + 8) = uVar1;
switchD_00117a66_caseD_0:
  std::pair<std::shared_ptr<cppnet::Log>,_std::function<void_(std::shared_ptr<cppnet::Log>)>_>::
  pair<std::shared_ptr<cppnet::Log>_&,_std::function<void_(std::shared_ptr<cppnet::Log>)>_&,_true>
            (__return_storage_ptr__,(shared_ptr<cppnet::Log> *)local_58,
             (function<void_(std::shared_ptr<cppnet::Log>)> *)&local_78);
LAB_00117c2f:
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  return __return_storage_ptr__;
}

Assistant:

LogStreamParam BaseLogger::GetStreamParam(LogLevel level, const char* file, uint32_t line) {
    // check log level can print
    if (level > _level) {
        return std::make_pair(nullptr, nullptr);
    }

    std::shared_ptr<Log> log = GetLog();
    std::function<void(std::shared_ptr<Log>)> cb;
    switch (level)
    {
    case LL_NULL:
        break;
    case LL_FATAL:
        cb = [this](std::shared_ptr<Log> l) { _logger->Fatal(l); };
        log->_len = FormatLog(file, line, "FAT", log->_log, log->_len);
        break;
    case LL_ERROR:
        cb = [this](std::shared_ptr<Log> l) { _logger->Error(l); };
        log->_len = FormatLog(file, line, "ERR", log->_log, log->_len);
        break;
    case LL_WARN:
        cb = [this](std::shared_ptr<Log> l) { _logger->Warn(l); };
        log->_len = FormatLog(file, line, "WAR", log->_log, log->_len);
        break;
    case LL_INFO:
        cb = [this](std::shared_ptr<Log> l) { _logger->Info(l); };
        log->_len = FormatLog(file, line, "INF", log->_log, log->_len);
        break;
    case LL_DEBUG:
        cb = [this](std::shared_ptr<Log> l) { _logger->Debug(l); };
        log->_len = FormatLog(file, line, "DEB", log->_log, log->_len);
        break;
    default:
        return std::make_pair(nullptr, nullptr);
    }

    return std::make_pair(log, cb);
}